

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest17::getFragmentShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest17 *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nin GS_DATA\n{\n    vec4 gs_data;\n    vec4 tc_data;\n    vec4 te_data;\n    vec4 vs_data;\n} gs;\n\nout vec4 result;\n\nsubroutine void subroutineTypeFS(out vec4 result);\n\nsubroutine(subroutineTypeFS) void subroutine1(out vec4 result)\n{\n    result = vec4(5, 6, 7, 8);\n}\n\nsubroutine uniform subroutineTypeFS function;\n\nvoid main()\n{\n    vec4 fs_data;\n\n    function(fs_data);\n    result = gs.gs_data + gs.tc_data + gs.te_data + gs.vs_data + fs_data;\n}\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest17::getFragmentShaderBody() const
{
	return "#version 400\n"
		   "\n"
		   "#extension GL_ARB_shader_subroutine : require\n"
		   "\n"
		   "in GS_DATA\n"
		   "{\n"
		   "    vec4 gs_data;\n"
		   "    vec4 tc_data;\n"
		   "    vec4 te_data;\n"
		   "    vec4 vs_data;\n"
		   "} gs;\n"
		   "\n"
		   "out vec4 result;\n"
		   "\n"
		   "subroutine void subroutineTypeFS(out vec4 result);\n"
		   "\n"
		   "subroutine(subroutineTypeFS) void subroutine1(out vec4 result)\n"
		   "{\n"
		   "    result = vec4(5, 6, 7, 8);\n"
		   "}\n"
		   "\n"
		   "subroutine uniform subroutineTypeFS function;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    vec4 fs_data;\n"
		   "\n"
		   "    function(fs_data);\n"
		   "    result = gs.gs_data + gs.tc_data + gs.te_data + gs.vs_data + fs_data;\n"
		   "}\n";
}